

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
llvm::cl::Option::addOccurrence
          (Option *this,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  int iVar1;
  raw_ostream *Errs;
  undefined4 in_register_00000034;
  char *Str;
  Twine TStack_38;
  
  if (!MultiArg) {
    this->NumOccurrences = this->NumOccurrences + 1;
  }
  if ((*(ushort *)&this->field_0xc & 7) == 2) {
    if (this->NumOccurrences < 2) goto LAB_0016b246;
    Str = "must occur exactly one time!";
  }
  else {
    if (((*(ushort *)&this->field_0xc & 7) != 0) || (this->NumOccurrences < 2)) {
LAB_0016b246:
      iVar1 = (**this->_vptr_Option)
                        (this,CONCAT44(in_register_00000034,pos),ArgName.Data,ArgName.Length,
                         Value.Data,Value.Length);
      return SUB41(iVar1,0);
    }
    Str = "may only occur zero or one times!";
  }
  Twine::Twine(&TStack_38,Str);
  Errs = errs();
  error(this,&TStack_38,ArgName,Errs);
  return true;
}

Assistant:

bool Option::addOccurrence(unsigned pos, StringRef ArgName, StringRef Value,
                           bool MultiArg) {
  if (!MultiArg)
    NumOccurrences++; // Increment the number of times we have been seen

  switch (getNumOccurrencesFlag()) {
  case Optional:
    if (NumOccurrences > 1)
      return error("may only occur zero or one times!", ArgName);
    break;
  case Required:
    if (NumOccurrences > 1)
      return error("must occur exactly one time!", ArgName);
    LLVM_FALLTHROUGH;
  case OneOrMore:
  case ZeroOrMore:
  case ConsumeAfter:
    break;
  }

  return handleOccurrence(pos, ArgName, Value);
}